

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decodeSeqHeaders(ZSTD_DCtx *dctx,int *nbSeqPtr,void *src,size_t srcSize)

{
  U16 UVar1;
  uint uVar2;
  U32 *baseValue;
  U32 *pUVar3;
  ZSTD_seqSymbol *DTableSpace;
  ZSTD_seqSymbol **DTablePtr;
  size_t sVar4;
  ZSTD_seqSymbol *in_RCX;
  U32 *pUVar5;
  byte *in_RDX;
  size_t unaff_RBX;
  uint *in_RSI;
  ZSTD_DCtx_s *in_RDI;
  int unaff_R12D;
  size_t mlhSize;
  size_t ofhSize;
  size_t llhSize;
  symbolEncodingType_e MLtype;
  symbolEncodingType_e OFtype;
  symbolEncodingType_e LLtype;
  int nbSeq;
  BYTE *ip;
  BYTE *iend;
  BYTE *istart;
  void *in_stack_fffffffffffffe88;
  undefined4 in_stack_ffffffffffffff58;
  U32 maxLog;
  undefined8 in_stack_ffffffffffffff68;
  ZSTD_seqSymbol **in_stack_ffffffffffffff70;
  ZSTD_seqSymbol *in_stack_ffffffffffffff78;
  uint local_74;
  U32 flagRepeatTable;
  int ddictIsCold;
  U32 *in_stack_ffffffffffffffc8;
  byte *pbVar6;
  
  baseValue = (U32 *)(in_RDX + (long)in_RCX);
  if (in_RCX == (ZSTD_seqSymbol *)0x0) {
    pbVar6 = (byte *)0xffffffffffffffb8;
  }
  else {
    pUVar5 = (U32 *)(in_RDX + 1);
    local_74 = (uint)*in_RDX;
    if (local_74 == 0) {
      *in_RSI = 0;
      if (in_RCX == (ZSTD_seqSymbol *)0x1) {
        pbVar6 = (byte *)0x1;
      }
      else {
        pbVar6 = (byte *)0xffffffffffffffb8;
      }
    }
    else {
      pUVar3 = pUVar5;
      pbVar6 = in_RDX;
      if (0x7f < local_74) {
        if (local_74 == 0xff) {
          if (baseValue < in_RDX + 3) {
            return 0xffffffffffffffb8;
          }
          UVar1 = MEM_readLE16(in_stack_fffffffffffffe88);
          local_74 = UVar1 + 0x7f00;
          pUVar3 = (U32 *)((long)pUVar5 + 2);
        }
        else {
          if (baseValue <= pUVar5) {
            return 0xffffffffffffffb8;
          }
          pUVar3 = (U32 *)(in_RDX + 2);
          local_74 = (local_74 - 0x80) * 0x100 + (uint)(byte)*pUVar5;
        }
      }
      flagRepeatTable = (U32)pbVar6;
      *in_RSI = local_74;
      if (baseValue < (U32 *)((long)pUVar3 + 1)) {
        pbVar6 = (byte *)0xffffffffffffffb8;
      }
      else {
        pbVar6 = (byte *)((long)pUVar3 + 1);
        maxLog = (U32)((ulong)in_RDI->workspace >> 0x20);
        ZSTD_DCtx_get_bmi2(in_RDI);
        ddictIsCold = (int)in_RSI;
        DTableSpace = (ZSTD_seqSymbol *)
                      ZSTD_buildSeqTable(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                         (symbolEncodingType_e)
                                         ((ulong)in_stack_ffffffffffffff68 >> 0x20),
                                         (uint)in_stack_ffffffffffffff68,maxLog,
                                         (void *)CONCAT44(local_74,in_stack_ffffffffffffff58),
                                         (size_t)pbVar6,baseValue,in_RDX,in_RCX,flagRepeatTable,
                                         ddictIsCold,(int)in_RDI,in_stack_ffffffffffffffc8,unaff_RBX
                                         ,unaff_R12D);
        uVar2 = ZSTD_isError(0x28fd74);
        if (uVar2 == 0) {
          pbVar6 = pbVar6 + (long)&DTableSpace->nextState;
          ZSTD_DCtx_get_bmi2(in_RDI);
          DTablePtr = (ZSTD_seqSymbol **)
                      ZSTD_buildSeqTable(DTableSpace,in_stack_ffffffffffffff70,
                                         (symbolEncodingType_e)
                                         ((ulong)in_stack_ffffffffffffff68 >> 0x20),
                                         (uint)in_stack_ffffffffffffff68,maxLog,
                                         (void *)CONCAT44(local_74,in_stack_ffffffffffffff58),
                                         (size_t)pbVar6,baseValue,in_RDX,in_RCX,flagRepeatTable,
                                         ddictIsCold,(int)in_RDI,in_stack_ffffffffffffffc8,unaff_RBX
                                         ,unaff_R12D);
          uVar2 = ZSTD_isError(0x28fee9);
          if (uVar2 == 0) {
            pbVar6 = (byte *)((long)DTablePtr + (long)pbVar6);
            ZSTD_DCtx_get_bmi2(in_RDI);
            sVar4 = ZSTD_buildSeqTable(DTableSpace,DTablePtr,
                                       (symbolEncodingType_e)
                                       ((ulong)in_stack_ffffffffffffff68 >> 0x20),
                                       (uint)in_stack_ffffffffffffff68,maxLog,
                                       (void *)CONCAT44(local_74,in_stack_ffffffffffffff58),
                                       (size_t)pbVar6,baseValue,in_RDX,in_RCX,flagRepeatTable,
                                       ddictIsCold,(int)in_RDI,in_stack_ffffffffffffffc8,unaff_RBX,
                                       unaff_R12D);
            uVar2 = ZSTD_isError(0x29003a);
            if (uVar2 == 0) {
              pbVar6 = pbVar6 + (sVar4 - (long)in_RDX);
            }
            else {
              pbVar6 = (byte *)0xffffffffffffffec;
            }
          }
          else {
            pbVar6 = (byte *)0xffffffffffffffec;
          }
        }
        else {
          pbVar6 = (byte *)0xffffffffffffffec;
        }
      }
    }
  }
  return (size_t)pbVar6;
}

Assistant:

size_t ZSTD_decodeSeqHeaders(ZSTD_DCtx* dctx, int* nbSeqPtr,
                             const void* src, size_t srcSize)
{
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* const iend = istart + srcSize;
    const BYTE* ip = istart;
    int nbSeq;
    DEBUGLOG(5, "ZSTD_decodeSeqHeaders");

    /* check */
    RETURN_ERROR_IF(srcSize < MIN_SEQUENCES_SIZE, srcSize_wrong, "");

    /* SeqHead */
    nbSeq = *ip++;
    if (!nbSeq) {
        *nbSeqPtr=0;
        RETURN_ERROR_IF(srcSize != 1, srcSize_wrong, "");
        return 1;
    }
    if (nbSeq > 0x7F) {
        if (nbSeq == 0xFF) {
            RETURN_ERROR_IF(ip+2 > iend, srcSize_wrong, "");
            nbSeq = MEM_readLE16(ip) + LONGNBSEQ;
            ip+=2;
        } else {
            RETURN_ERROR_IF(ip >= iend, srcSize_wrong, "");
            nbSeq = ((nbSeq-0x80)<<8) + *ip++;
        }
    }
    *nbSeqPtr = nbSeq;

    /* FSE table descriptors */
    RETURN_ERROR_IF(ip+1 > iend, srcSize_wrong, ""); /* minimum possible size: 1 byte for symbol encoding types */
    {   symbolEncodingType_e const LLtype = (symbolEncodingType_e)(*ip >> 6);
        symbolEncodingType_e const OFtype = (symbolEncodingType_e)((*ip >> 4) & 3);
        symbolEncodingType_e const MLtype = (symbolEncodingType_e)((*ip >> 2) & 3);
        ip++;

        /* Build DTables */
        {   size_t const llhSize = ZSTD_buildSeqTable(dctx->entropy.LLTable, &dctx->LLTptr,
                                                      LLtype, MaxLL, LLFSELog,
                                                      ip, iend-ip,
                                                      LL_base, LL_bits,
                                                      LL_defaultDTable, dctx->fseEntropy,
                                                      dctx->ddictIsCold, nbSeq,
                                                      dctx->workspace, sizeof(dctx->workspace),
                                                      ZSTD_DCtx_get_bmi2(dctx));
            RETURN_ERROR_IF(ZSTD_isError(llhSize), corruption_detected, "ZSTD_buildSeqTable failed");
            ip += llhSize;
        }

        {   size_t const ofhSize = ZSTD_buildSeqTable(dctx->entropy.OFTable, &dctx->OFTptr,
                                                      OFtype, MaxOff, OffFSELog,
                                                      ip, iend-ip,
                                                      OF_base, OF_bits,
                                                      OF_defaultDTable, dctx->fseEntropy,
                                                      dctx->ddictIsCold, nbSeq,
                                                      dctx->workspace, sizeof(dctx->workspace),
                                                      ZSTD_DCtx_get_bmi2(dctx));
            RETURN_ERROR_IF(ZSTD_isError(ofhSize), corruption_detected, "ZSTD_buildSeqTable failed");
            ip += ofhSize;
        }

        {   size_t const mlhSize = ZSTD_buildSeqTable(dctx->entropy.MLTable, &dctx->MLTptr,
                                                      MLtype, MaxML, MLFSELog,
                                                      ip, iend-ip,
                                                      ML_base, ML_bits,
                                                      ML_defaultDTable, dctx->fseEntropy,
                                                      dctx->ddictIsCold, nbSeq,
                                                      dctx->workspace, sizeof(dctx->workspace),
                                                      ZSTD_DCtx_get_bmi2(dctx));
            RETURN_ERROR_IF(ZSTD_isError(mlhSize), corruption_detected, "ZSTD_buildSeqTable failed");
            ip += mlhSize;
        }
    }

    return ip-istart;
}